

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::CollationIterator::nextCE32FromDiscontiguousContraction
          (CollationIterator *this,CollationData *d,UCharsTrie *suffixes,uint32_t ce32,
          int32_t lookAhead,UChar32 c,UErrorCode *errorCode)

{
  short sVar1;
  ushort uVar2;
  char16_t *pcVar3;
  _func_int **pp_Var4;
  UBool UVar5;
  uint16_t uVar6;
  ushort uVar7;
  uint uVar8;
  int cp;
  UStringTrieResult UVar9;
  uint32_t ce32_00;
  SkippedState *pSVar10;
  int32_t iVar11;
  int iVar12;
  size_t size;
  bool bVar13;
  undefined1 auVar14 [16];
  ushort local_4e;
  uint32_t local_4c;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  local_4e = CollationData::getFCD16(d,c);
  uVar8 = nextSkippedCodePoint(this,errorCode);
  if ((int)uVar8 < 0) {
    backwardNumSkipped(this,1,errorCode);
    return ce32;
  }
  size = (size_t)uVar8;
  uVar6 = CollationData::getFCD16(d,uVar8);
  if (uVar6 < 0x100) {
    backwardNumSkipped(this,2,errorCode);
    return ce32;
  }
  pSVar10 = this->skipped;
  if (pSVar10 == (SkippedState *)0x0) {
    pSVar10 = (SkippedState *)UMemory::operator_new((UMemory *)0xa8,size);
    if (pSVar10 == (SkippedState *)0x0) {
      this->skipped = (SkippedState *)0x0;
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
      return 0;
    }
    (pSVar10->oldBuffer).super_Replaceable.super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_00471e80;
    (pSVar10->oldBuffer).fUnion.fStackFields.fLengthAndFlags = 2;
    (pSVar10->newBuffer).super_Replaceable.super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_00471e80;
    (pSVar10->newBuffer).fUnion.fStackFields.fLengthAndFlags = 2;
    pSVar10->pos = 0;
    pSVar10->skipLengthAtMatch = 0;
    (pSVar10->state).uchars = (char16_t *)0x0;
    this->skipped = pSVar10;
  }
  else if (0x1f < (ushort)(pSVar10->oldBuffer).fUnion.fStackFields.fLengthAndFlags) {
    UCharsTrie::resetToState(suffixes,&pSVar10->state);
    pSVar10 = this->skipped;
    goto LAB_0022fdee;
  }
  pcVar3 = suffixes->uchars_;
  suffixes->pos_ = pcVar3;
  suffixes->remainingMatchLength_ = -1;
  if (lookAhead < 2) {
    auVar14._8_4_ = (int)pcVar3;
    auVar14._0_8_ = pcVar3;
    auVar14._12_4_ = (int)((ulong)pcVar3 >> 0x20);
    iVar11 = -1;
  }
  else {
    (*(this->super_UObject)._vptr_UObject[0xd])(this,(ulong)(lookAhead + 1),errorCode);
    iVar12 = (*(this->super_UObject)._vptr_UObject[6])(this,errorCode);
    UCharsTrie::firstForCodePoint(suffixes,iVar12);
    iVar12 = lookAhead + -2;
    while( true ) {
      pp_Var4 = (this->super_UObject)._vptr_UObject;
      bVar13 = iVar12 == 0;
      iVar12 = iVar12 + -1;
      if (bVar13) break;
      cp = (*pp_Var4[6])(this,errorCode);
      UCharsTrie::nextForCodePoint(suffixes,cp);
    }
    (*pp_Var4[0xc])(this,2,errorCode);
    pSVar10 = this->skipped;
    auVar14._0_8_ = suffixes->uchars_;
    auVar14._8_8_ = suffixes->pos_;
    iVar11 = suffixes->remainingMatchLength_;
  }
  (pSVar10->state).uchars = (char16_t *)auVar14._0_8_;
  (pSVar10->state).pos = (char16_t *)auVar14._8_8_;
  (pSVar10->state).remainingMatchLength = iVar11;
LAB_0022fdee:
  SkippedState::setFirstSkipped(pSVar10,c);
  iVar12 = 2;
  local_4c = ce32;
  do {
    if (((local_4e & 0xff) < uVar6 >> 8) &&
       (UVar9 = UCharsTrie::nextForCodePoint(suffixes,uVar8), 1 < (int)UVar9)) {
      local_4c = UCharsTrie::getValue(suffixes);
      pSVar10 = this->skipped;
      sVar1 = (pSVar10->newBuffer).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar12 = (pSVar10->newBuffer).fUnion.fFields.fLength;
      }
      else {
        iVar12 = (int)sVar1 >> 5;
      }
      pSVar10->skipLengthAtMatch = iVar12;
      if ((UVar9 & USTRINGTRIE_NO_VALUE) == USTRINGTRIE_NO_MATCH) {
        iVar12 = 0;
        break;
      }
      pcVar3 = suffixes->pos_;
      (pSVar10->state).uchars = suffixes->uchars_;
      (pSVar10->state).pos = pcVar3;
      (pSVar10->state).remainingMatchLength = suffixes->remainingMatchLength_;
      iVar12 = 0;
    }
    else {
      icu_63::UnicodeString::append(&this->skipped->newBuffer,uVar8);
      UCharsTrie::resetToState(suffixes,&this->skipped->state);
      local_4e = uVar6;
    }
    uVar8 = nextSkippedCodePoint(this,errorCode);
    if ((int)uVar8 < 0) break;
    iVar12 = iVar12 + 1;
    uVar6 = CollationData::getFCD16(d,uVar8);
  } while (0xff < uVar6);
  backwardNumSkipped(this,iVar12,errorCode);
  uVar2 = (this->skipped->oldBuffer).fUnion.fStackFields.fLengthAndFlags;
  SkippedState::replaceMatch(this->skipped);
  if ((uVar2 < 0x20) &&
     (0x1f < (ushort)(this->skipped->oldBuffer).fUnion.fStackFields.fLengthAndFlags)) {
    uVar8 = 0xffffffff;
    ce32_00 = local_4c;
    while( true ) {
      local_4c = 1;
      appendCEsFromCE32(this,d,uVar8,ce32_00,'\x01',errorCode);
      UVar5 = SkippedState::hasNext(this->skipped);
      pSVar10 = this->skipped;
      if (UVar5 == '\0') break;
      uVar8 = SkippedState::next(pSVar10);
      ce32_00 = (*(this->super_UObject)._vptr_UObject[0xe])(this,(ulong)uVar8);
      d = this->data;
      if (ce32_00 == 0xc0) {
        d = d->base;
        ce32_00 = CollationData::getCE32(d,uVar8);
      }
    }
    uVar2 = (pSVar10->oldBuffer).fUnion.fStackFields.fLengthAndFlags;
    uVar7 = 2;
    if ((uVar2 & 1) == 0) {
      uVar7 = uVar2 & 0x1e;
    }
    (pSVar10->oldBuffer).fUnion.fStackFields.fLengthAndFlags = uVar7;
    pSVar10->pos = 0;
  }
  return local_4c;
}

Assistant:

uint32_t
CollationIterator::nextCE32FromDiscontiguousContraction(
        const CollationData *d, UCharsTrie &suffixes, uint32_t ce32,
        int32_t lookAhead, UChar32 c,
        UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }

    // UCA section 3.3.2 Contractions:
    // Contractions that end with non-starter characters
    // are known as discontiguous contractions.
    // ... discontiguous contractions must be detected in input text
    // whenever the final sequence of non-starter characters could be rearranged
    // so as to make a contiguous matching sequence that is canonically equivalent.

    // UCA: http://www.unicode.org/reports/tr10/#S2.1
    // S2.1 Find the longest initial substring S at each point that has a match in the table.
    // S2.1.1 If there are any non-starters following S, process each non-starter C.
    // S2.1.2 If C is not blocked from S, find if S + C has a match in the table.
    //     Note: A non-starter in a string is called blocked
    //     if there is another non-starter of the same canonical combining class or zero
    //     between it and the last character of canonical combining class 0.
    // S2.1.3 If there is a match, replace S by S + C, and remove C.

    // First: Is a discontiguous contraction even possible?
    uint16_t fcd16 = d->getFCD16(c);
    U_ASSERT(fcd16 > 0xff);  // The caller checked this already, as a shortcut.
    UChar32 nextCp = nextSkippedCodePoint(errorCode);
    if(nextCp < 0) {
        // No further text.
        backwardNumSkipped(1, errorCode);
        return ce32;
    }
    ++lookAhead;
    uint8_t prevCC = (uint8_t)fcd16;
    fcd16 = d->getFCD16(nextCp);
    if(fcd16 <= 0xff) {
        // The next code point after c is a starter (S2.1.1 "process each non-starter").
        backwardNumSkipped(2, errorCode);
        return ce32;
    }

    // We have read and matched (lookAhead-2) code points,
    // read non-matching c and peeked ahead at nextCp.
    // Return to the state before the mismatch and continue matching with nextCp.
    if(skipped == NULL || skipped->isEmpty()) {
        if(skipped == NULL) {
            skipped = new SkippedState();
            if(skipped == NULL) {
                errorCode = U_MEMORY_ALLOCATION_ERROR;
                return 0;
            }
        }
        suffixes.reset();
        if(lookAhead > 2) {
            // Replay the partial match so far.
            backwardNumCodePoints(lookAhead, errorCode);
            suffixes.firstForCodePoint(nextCodePoint(errorCode));
            for(int32_t i = 3; i < lookAhead; ++i) {
                suffixes.nextForCodePoint(nextCodePoint(errorCode));
            }
            // Skip c (which did not match) and nextCp (which we will try now).
            forwardNumCodePoints(2, errorCode);
        }
        skipped->saveTrieState(suffixes);
    } else {
        // Reset to the trie state before the failed match of c.
        skipped->resetToTrieState(suffixes);
    }

    skipped->setFirstSkipped(c);
    // Number of code points read since the last match (at this point: c and nextCp).
    int32_t sinceMatch = 2;
    c = nextCp;
    for(;;) {
        UStringTrieResult match;
        // "If C is not blocked from S, find if S + C has a match in the table." (S2.1.2)
        if(prevCC < (fcd16 >> 8) && USTRINGTRIE_HAS_VALUE(match = suffixes.nextForCodePoint(c))) {
            // "If there is a match, replace S by S + C, and remove C." (S2.1.3)
            // Keep prevCC unchanged.
            ce32 = (uint32_t)suffixes.getValue();
            sinceMatch = 0;
            skipped->recordMatch();
            if(!USTRINGTRIE_HAS_NEXT(match)) { break; }
            skipped->saveTrieState(suffixes);
        } else {
            // No match for "S + C", skip C.
            skipped->skip(c);
            skipped->resetToTrieState(suffixes);
            prevCC = (uint8_t)fcd16;
        }
        if((c = nextSkippedCodePoint(errorCode)) < 0) { break; }
        ++sinceMatch;
        fcd16 = d->getFCD16(c);
        if(fcd16 <= 0xff) {
            // The next code point after c is a starter (S2.1.1 "process each non-starter").
            break;
        }
    }
    backwardNumSkipped(sinceMatch, errorCode);
    UBool isTopDiscontiguous = skipped->isEmpty();
    skipped->replaceMatch();
    if(isTopDiscontiguous && !skipped->isEmpty()) {
        // We did get a match after skipping one or more combining marks,
        // and we are not in a recursive discontiguous contraction.
        // Append CEs from the contraction ce32
        // and then from the combining marks that we skipped before the match.
        c = U_SENTINEL;
        for(;;) {
            appendCEsFromCE32(d, c, ce32, TRUE, errorCode);
            // Fetch CE32s for skipped combining marks from the normal data, with fallback,
            // rather than from the CollationData where we found the contraction.
            if(!skipped->hasNext()) { break; }
            c = skipped->next();
            ce32 = getDataCE32(c);
            if(ce32 == Collation::FALLBACK_CE32) {
                d = data->base;
                ce32 = d->getCE32(c);
            } else {
                d = data;
            }
            // Note: A nested discontiguous-contraction match
            // replaces consumed combining marks with newly skipped ones
            // and resets the reading position to the beginning.
        }
        skipped->clear();
        ce32 = Collation::NO_CE32;  // Signal to the caller that the result is in the ceBuffer.
    }
    return ce32;
}